

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::
UntypedPerformAction
          (FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *this,
          void *untyped_action,void *untyped_args)

{
  ActionResultHolder<TestExprBuilder<1,_BasicTestExpr<1>_>_> *pAVar1;
  Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *in_RDX;
  ArgumentTuple *args;
  Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> action;
  Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *in_stack_ffffffffffffffa8;
  ArgumentTuple *in_stack_ffffffffffffffc8;
  Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> local_28;
  Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *local_18;
  
  local_18 = in_RDX;
  Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::Action
            (&local_28,in_stack_ffffffffffffffa8);
  pAVar1 = ActionResultHolder<TestExprBuilder<1,BasicTestExpr<1>>>::
           PerformAction<TestExprBuilder<1,BasicTestExpr<1>>(mp::expr::Kind,int)>
                     (local_18,in_stack_ffffffffffffffc8);
  Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::~Action
            ((Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *)0x1cbd91);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }